

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::NextColumn(void)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *window_00;
  float fVar4;
  float width;
  float offset_1;
  float offset_0;
  float column_padding;
  ImGuiOldColumnData *column;
  ImGuiOldColumns *columns;
  ImGuiContext *g;
  ImGuiWindow *window;
  float local_2c;
  float in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  float fVar5;
  ImDrawList *draw_list;
  ImGuiContext *this;
  
  pIVar3 = GetCurrentWindow();
  this = GImGui;
  if (((pIVar3->SkipItems & 1U) == 0) && ((pIVar3->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
    draw_list = (ImDrawList *)(pIVar3->DC).CurrentColumns;
    if ((draw_list->IdxBuffer).Size == 1) {
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
    }
    else {
      iVar2 = *(int *)((long)&(draw_list->CmdBuffer).Data + 4) + 1;
      *(int *)((long)&(draw_list->CmdBuffer).Data + 4) = iVar2;
      if (iVar2 == (draw_list->IdxBuffer).Size) {
        *(int *)((long)&(draw_list->CmdBuffer).Data + 4) = 0;
      }
      PopItemWidth();
      window_00 = (ImGuiWindow *)
                  ImVector<ImGuiOldColumnData>::operator[]
                            ((ImVector<ImGuiOldColumnData> *)&(draw_list->_ClipRectStack).Data,
                             *(int *)((long)&(draw_list->CmdBuffer).Data + 4));
      SetWindowClipRectBeforeSetChannel
                (window_00,(ImRect *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      ImDrawListSplitter::SetCurrentChannel
                ((ImDrawListSplitter *)this,draw_list,(int)((ulong)window_00 >> 0x20));
      fVar5 = (this->Style).ItemSpacing.x;
      fVar4 = ImMax<float>((float)(draw_list->VtxBuffer).Size,(pIVar3->DC).CursorPos.y);
      (draw_list->VtxBuffer).Size = (int)fVar4;
      if (*(int *)((long)&(draw_list->CmdBuffer).Data + 4) < 1) {
        fVar4 = ImMax<float>(fVar5 - (pIVar3->WindowPadding).x,0.0);
        (pIVar3->DC).ColumnsOffset.x = fVar4;
        (pIVar3->DC).IsSameLine = false;
        *(int *)((long)&(draw_list->IdxBuffer).Data + 4) = (draw_list->VtxBuffer).Size;
      }
      else {
        fVar4 = GetColumnOffset((int)window_00);
        (pIVar3->DC).ColumnsOffset.x = (fVar4 - (pIVar3->DC).Indent.x) + fVar5;
      }
      (pIVar3->DC).CursorPos.x =
           (float)(int)((pIVar3->Pos).x + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
      (pIVar3->DC).CursorPos.y = *(float *)((long)&(draw_list->IdxBuffer).Data + 4);
      ImVec2::ImVec2((ImVec2 *)&local_2c,0.0,0.0);
      IVar1.y = in_stack_ffffffffffffffd8;
      IVar1.x = local_2c;
      (pIVar3->DC).CurrLineSize = IVar1;
      (pIVar3->DC).CurrLineTextBaseOffset = 0.0;
      GetColumnOffset((int)window_00);
      fVar4 = GetColumnOffset((int)window_00);
      PushItemWidth((float)((ulong)window_00 >> 0x20));
      (pIVar3->WorkRect).Max.x = ((pIVar3->Pos).x + fVar4) - fVar5;
    }
  }
  return;
}

Assistant:

void ImGui::NextColumn()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems || window->DC.CurrentColumns == NULL)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;

    if (columns->Count == 1)
    {
        window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
        IM_ASSERT(columns->Current == 0);
        return;
    }

    // Next column
    if (++columns->Current == columns->Count)
        columns->Current = 0;

    PopItemWidth();

    // Optimization: avoid PopClipRect() + SetCurrentChannel() + PushClipRect()
    // (which would needlessly attempt to update commands in the wrong channel, then pop or overwrite them),
    ImGuiOldColumnData* column = &columns->Columns[columns->Current];
    SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, columns->Current + 1);

    const float column_padding = g.Style.ItemSpacing.x;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    if (columns->Current > 0)
    {
        // Columns 1+ ignore IndentX (by canceling it out)
        // FIXME-COLUMNS: Unnecessary, could be locked?
        window->DC.ColumnsOffset.x = GetColumnOffset(columns->Current) - window->DC.Indent.x + column_padding;
    }
    else
    {
        // New row/line: column 0 honor IndentX.
        window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
        window->DC.IsSameLine = false;
        columns->LineMinY = columns->LineMaxY;
    }
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = columns->LineMinY;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // FIXME-COLUMNS: Share code with BeginColumns() - move code on columns setup.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}